

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O1

int xmlStrcmp(xmlChar *str1,xmlChar *str2)

{
  byte bVar1;
  long lVar2;
  
  if (str1 != str2) {
    if (str1 == (xmlChar *)0x0) {
      return -1;
    }
    if (str2 == (xmlChar *)0x0) {
      return 1;
    }
    lVar2 = 0;
    do {
      bVar1 = str2[lVar2];
      if (str1[lVar2] != bVar1) {
        return (uint)str1[lVar2] - (uint)bVar1;
      }
      lVar2 = lVar2 + 1;
    } while (bVar1 != 0);
  }
  return 0;
}

Assistant:

int
xmlStrcmp(const xmlChar *str1, const xmlChar *str2) {
    if (str1 == str2) return(0);
    if (str1 == NULL) return(-1);
    if (str2 == NULL) return(1);
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
    return(strcmp((const char *)str1, (const char *)str2));
#else
    do {
        int tmp = *str1++ - *str2;
        if (tmp != 0) return(tmp);
    } while (*str2++ != 0);
    return 0;
#endif
}